

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

uint16_t paeth_predictor_single(uint16_t left,uint16_t top,uint16_t top_left)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined2 in_register_00000012;
  undefined6 in_register_00000032;
  uint uVar6;
  uint uVar7;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_00000032,top);
  iVar2 = (int)CONCAT62(in_register_0000003a,left);
  iVar4 = (iVar1 + iVar2) - CONCAT22(in_register_00000012,top_left);
  uVar6 = iVar4 - iVar2;
  uVar3 = -uVar6;
  if (0 < (int)uVar6) {
    uVar3 = uVar6;
  }
  uVar7 = iVar4 - iVar1;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  uVar5 = iVar4 - CONCAT22(in_register_00000012,top_left);
  uVar7 = -uVar5;
  if (0 < (int)uVar5) {
    uVar7 = uVar5;
  }
  if (uVar7 < uVar6) {
    top = top_left;
  }
  if (uVar7 < uVar3) {
    left = top;
  }
  if (uVar6 < uVar3) {
    left = top;
  }
  return left;
}

Assistant:

static inline uint16_t paeth_predictor_single(uint16_t left, uint16_t top,
                                              uint16_t top_left) {
  const int base = top + left - top_left;
  const int p_left = abs_diff(base, left);
  const int p_top = abs_diff(base, top);
  const int p_top_left = abs_diff(base, top_left);

  // Return nearest to base of left, top and top_left.
  return (p_left <= p_top && p_left <= p_top_left) ? left
         : (p_top <= p_top_left)                   ? top
                                                   : top_left;
}